

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set<>(ArenaStringPtr *this,string *value,Arena *arena)

{
  pointer pcVar1;
  string *psVar2;
  TaggedStringPtr TVar3;
  char *in_RCX;
  string_view value_00;
  string_view s;
  
  if (((ulong)(this->tagged_ptr_).ptr_ & 3) != 0) {
    psVar2 = UnsafeMutablePointer_abi_cxx11_(this);
    std::__cxx11::string::_M_assign((string *)psVar2);
    return;
  }
  pcVar1 = (value->_M_dataplus)._M_p;
  if (arena == (Arena *)0x0) {
    value_00._M_str = (char *)0x0;
    value_00._M_len = (size_t)pcVar1;
    TVar3 = anon_unknown_8::CreateString((anon_unknown_8 *)value->_M_string_length,value_00);
  }
  else {
    s._M_str = in_RCX;
    s._M_len = (size_t)pcVar1;
    TVar3 = anon_unknown_8::CreateArenaString
                      ((anon_unknown_8 *)arena,(Arena *)value->_M_string_length,s);
  }
  (this->tagged_ptr_).ptr_ = TVar3.ptr_;
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string& value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    // If we're not on an arena, skip straight to a true string to avoid
    // possible copy cost later.
    tagged_ptr_ = arena != nullptr ? CreateArenaString(*arena, value)
                                   : CreateString(value);
  } else {
    if (internal::DebugHardenForceCopyDefaultString()) {
      if (arena == nullptr) {
        auto* old = tagged_ptr_.GetIfAllocated();
        tagged_ptr_ = CreateString(value);
        delete old;
      } else {
        auto* old = UnsafeMutablePointer();
        tagged_ptr_ = CreateArenaString(*arena, value);
        old->assign("garbagedata");
      }
    } else {
      UnsafeMutablePointer()->assign(value);
    }
  }
}